

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Message.cpp
# Opt level: O1

string * __thiscall Message::str_abi_cxx11_(string *__return_storage_ptr__,Message *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"o=",2);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,(this->o)._M_dataplus._M_p,(this->o)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", t=",4);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", v=",4);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", n=",4);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", c=",4);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,this->c);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,", d=",4);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(this->d)._M_dataplus._M_p,(this->d)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,")",1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string Message::str() const{
    std::stringstream ss;
    ss
        <<"o="<<o
        <<", t="<<t
        <<", v="<<v
        <<", n="<<n
        <<", c="<<c
        <<", d="<<d
        <<")";
    return ss.str();
}